

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  *(undefined8 *)&this[-1].field_0x38 = 0x8b1c48;
  *(undefined8 *)&this->field_0x20 = 0x8b1cc0;
  *(undefined8 *)&this[-1].field_0xc0 = 0x8b1c70;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b1c98;
  if (*(undefined1 **)&this[-1].field_0xe0 != &this[-1].field_0xf0) {
    operator_delete(*(undefined1 **)&this[-1].field_0xe0);
  }
  *(undefined8 *)&this[-1].field_0x38 = 0x8b1d60;
  *(undefined8 *)&this->field_0x20 = 0x8b1d88;
  if (*(undefined1 **)&this[-1].field_0x98 != &this[-1].field_0xa8) {
    operator_delete(*(undefined1 **)&this[-1].field_0x98);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70);
  }
  if (*(undefined1 **)&this[-1].field_0x48 != &this[-1].field_0x58) {
    operator_delete(*(undefined1 **)&this[-1].field_0x48);
  }
  operator_delete(&this[-1].field_0x38);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}